

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-string.h
# Opt level: O1

String * __thiscall testing::internal::String::operator=(String *this,String *rhs)

{
  char *__src;
  size_t __n;
  char *__dest;
  
  if (this != rhs) {
    if (this->c_str_ != (char *)0x0) {
      operator_delete__(this->c_str_);
    }
    __src = rhs->c_str_;
    if (__src == (char *)0x0) {
      this->c_str_ = (char *)0x0;
      this->length_ = 0;
    }
    else {
      __n = rhs->length_;
      __dest = (char *)operator_new__(__n + 1);
      memcpy(__dest,__src,__n);
      __dest[__n] = '\0';
      this->c_str_ = __dest;
      this->length_ = __n;
    }
  }
  return this;
}

Assistant:

const String& operator=(const String& rhs) {
    if (this != &rhs) {
      delete[] c_str_;
      if (rhs.c_str() == NULL) {
        c_str_ = NULL;
        length_ = 0;
      } else {
        ConstructNonNull(rhs.c_str(), rhs.length());
      }
    }

    return *this;
  }